

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscStatements.cpp
# Opt level: O2

bool slang::ast::isValidAssignLVal(Expression *expr)

{
  long lVar1;
  Type *pTVar2;
  bool bVar3;
  Symbol *pSVar4;
  uint uVar5;
  long lVar6;
  byte bVar7;
  
  if (expr->kind - NamedValue < 2) {
    pSVar4 = Expression::getSymbolReference(expr,true);
    if (pSVar4 == (Symbol *)0x0) {
      bVar7 = 1;
      goto LAB_003e0ff0;
    }
    uVar5 = pSVar4->kind - Variable;
    if (uVar5 < 0x19) {
      bVar7 = (byte)(0x1800c0f >> ((byte)uVar5 & 0x1f));
      goto LAB_003e0ff0;
    }
  }
  else if (expr->kind == Concatenation) {
    lVar1 = *(long *)(expr + 1);
    pTVar2 = expr[1].type.ptr;
    lVar6 = 0;
    do {
      bVar7 = (long)pTVar2 << 3 == lVar6;
      if ((bool)bVar7) break;
      bVar3 = isValidAssignLVal(*(Expression **)(lVar1 + lVar6));
      lVar6 = lVar6 + 8;
    } while (bVar3);
    goto LAB_003e0ff0;
  }
  bVar7 = 0;
LAB_003e0ff0:
  return (bool)(bVar7 & 1);
}

Assistant:

static bool isValidAssignLVal(const Expression& expr) {
    switch (expr.kind) {
        case ExpressionKind::NamedValue:
        case ExpressionKind::HierarchicalValue:
            if (auto sym = expr.getSymbolReference()) {
                if (!VariableSymbol::isKind(sym->kind))
                    return false;
            }
            return true;
        case ExpressionKind::Concatenation:
            for (auto op : expr.as<ConcatenationExpression>().operands()) {
                if (!isValidAssignLVal(*op))
                    return false;
            }
            return true;
        default:
            return false;
    }
}